

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_brand_verb(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  brand *brand;
  char *verb;
  parser *p_local;
  
  pcVar1 = parser_getstr(p,"verb");
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    string_free(*(char **)((long)pvVar2 + 0x10));
    pcVar1 = string_make(pcVar1);
    *(char **)((long)pvVar2 + 0x10) = pcVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_brand_verb(struct parser *p) {
	const char *verb = parser_getstr(p, "verb");
	struct brand *brand = parser_priv(p);

	if (!brand) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	string_free(brand->verb);
	brand->verb = string_make(verb);
	return PARSE_ERROR_NONE;
}